

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O1

void __thiscall
v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::clear(v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar1;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  
  uVar1 = this->erase_count + 1;
  this->erase_count = uVar1;
  if (0x3ff < uVar1) {
    resize(this,(long)this->_end - (long)this->_begin >> 4);
    this->erase_count = 0;
  }
  for (psVar2 = this->_begin; psVar2 != this->_end; psVar2 = psVar2 + 1) {
    this_00 = (psVar2->
              super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  this->_end = this->_begin;
  return;
}

Assistant:

void clear()
  {
    if (++erase_count & erase_point)
    {
      resize(_end - _begin);
      erase_count = 0;
    }
    for (T* item = _begin; item != _end; ++item) item->~T();
    _end = _begin;
  }